

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vgmplayer_cmdhandler.cpp
# Opt level: O2

void __thiscall VGMPlayer::Cmd_PWM_Reg(VGMPlayer *this)

{
  byte bVar1;
  CHIP_DEVICE *pCVar2;
  
  pCVar2 = GetDevicePtr(this,_CMD_INFO[this->_fileData[this->_filePos]].chipType,'\0');
  if ((pCVar2 != (CHIP_DEVICE *)0x0) && (pCVar2->writeD16 != (DEVFUNC_WRITE_A8D16)0x0)) {
    bVar1 = this->_fileData[(ulong)this->_filePos + 1];
    (*pCVar2->writeD16)((pCVar2->base).defInf.dataPtr,bVar1 >> 4,
                        (bVar1 & 0xf) << 8 | (ushort)this->_fileData[(ulong)this->_filePos + 2]);
    return;
  }
  return;
}

Assistant:

void VGMPlayer::Cmd_PWM_Reg(void)
{
	UINT8 chipType = _CMD_INFO[fData[0x00]].chipType;
	UINT8 chipID = 0;
	CHIP_DEVICE* cDev = GetDevicePtr(chipType, chipID);
	if (cDev == NULL || cDev->writeD16 == NULL)
		return;
	
	UINT8 ofs = (fData[0x01] >> 4) & 0x0F;
	UINT16 value = ReadBE16(&fData[0x01]) & 0x0FFF;
	cDev->writeD16(cDev->base.defInf.dataPtr, ofs, value);
	return;
}